

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O2

void __thiscall
type_safe::detail::
swap_union<type_safe::optional_variant_policy,type_safe::tagged_union<int,double,debugger_type>>::
visitor::operator()(visitor *this,int *param_1,tagged_union<int,_double,_debugger_type> *a,
                   tagged_union<int,_double,_debugger_type> *b)

{
  undefined4 uVar1;
  int tmp;
  undefined4 local_1c;
  
  if ((b->cur_type_).
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 1) {
    tagged_union<int,_double,_debugger_type>::check<int>(a);
    tagged_union<int,_double,_debugger_type>::check<int>(b);
    uVar1 = *(undefined4 *)(a->storage_).storage_;
    *(undefined4 *)(a->storage_).storage_ = *(undefined4 *)(b->storage_).storage_;
    *(undefined4 *)(b->storage_).storage_ = uVar1;
  }
  else {
    tagged_union<int,_double,_debugger_type>::check<int>(a);
    local_1c = *(undefined4 *)(a->storage_).storage_;
    move_assign_union_value<type_safe::optional_variant_policy,_type_safe::tagged_union<int,_double,_debugger_type>_>
    ::assign(a,b);
    optional_variant_policy::change_value<int,int,double,debugger_type,int>(b,&local_1c);
  }
  return;
}

Assistant:

void operator()(T&, Union& a, Union& b)
            {
                constexpr auto id = typename Union::type_id(union_type<T>{});
                DEBUG_ASSERT(a.type() == id, detail::assert_handler{});

                if (b.type() == id)
                {
                    using std::swap;
                    swap(a.value(union_type<T>{}), b.value(union_type<T>{}));
                }
                else
                {
                    T tmp(std::move(a).value(union_type<T>{})); // save old value from a
                    // assign a to value in b
                    move_assign_union_value<VariantPolicy, Union>::assign(a, std::move(b));
                    // change value in b to tmp
                    VariantPolicy::change_value(union_type<T>{}, b, std::move(tmp));
                }
            }